

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_selectable(nk_command_buffer *out,nk_flags state,nk_style_selectable *style,int active,
                       nk_rect *bounds,nk_rect *icon,nk_image *img,char *string,int len,
                       nk_flags align,nk_user_font *font)

{
  nk_style_selectable *pnVar1;
  nk_text local_40;
  
  local_40.padding = style->padding;
  if (active == 0) {
    if ((state & 0x20) == 0) {
      if ((state & 0x10) == 0) {
        local_40.text = style->text_normal;
        pnVar1 = style;
      }
      else {
        pnVar1 = (nk_style_selectable *)&style->hover;
        local_40.text = style->text_hover;
      }
    }
    else {
      pnVar1 = (nk_style_selectable *)&style->pressed;
      local_40.text = style->text_pressed;
    }
  }
  else if ((state & 0x20) == 0) {
    if ((state & 0x10) == 0) {
      pnVar1 = (nk_style_selectable *)&style->normal_active;
      local_40.text = style->text_normal_active;
    }
    else {
      pnVar1 = (nk_style_selectable *)&style->hover_active;
      local_40.text = style->text_hover_active;
    }
  }
  else {
    pnVar1 = (nk_style_selectable *)&style->pressed_active;
    local_40.text = style->text_pressed_active;
  }
  if ((pnVar1->normal).type == NK_STYLE_ITEM_IMAGE) {
    nk_draw_image(out,*bounds,&(pnVar1->normal).data.image,(nk_color)0xffffffff);
    local_40.background.r = '\0';
    local_40.background.g = '\0';
    local_40.background.b = '\0';
    local_40.background.a = '\0';
  }
  else {
    nk_fill_rect(out,*bounds,style->rounding,(pnVar1->normal).data.color);
    local_40.background = (pnVar1->normal).data.color;
  }
  if (icon != (nk_rect *)0x0 && img != (nk_image *)0x0) {
    nk_draw_image(out,*icon,img,(nk_color)0xffffffff);
  }
  nk_widget_text(out,*bounds,string,len,&local_40,align,font);
  return;
}

Assistant:

NK_INTERN void
nk_draw_selectable(struct nk_command_buffer *out,
    nk_flags state, const struct nk_style_selectable *style, int active,
    const struct nk_rect *bounds, const struct nk_rect *icon, const struct nk_image *img,
    const char *string, int len, nk_flags align, const struct nk_user_font *font)
{
    const struct nk_style_item *background;
    struct nk_text text;
    text.padding = style->padding;

    /* select correct colors/images */
    if (!active) {
        if (state & NK_WIDGET_STATE_ACTIVED) {
            background = &style->pressed;
            text.text = style->text_pressed;
        } else if (state & NK_WIDGET_STATE_HOVER) {
            background = &style->hover;
            text.text = style->text_hover;
        } else {
            background = &style->normal;
            text.text = style->text_normal;
        }
    } else {
        if (state & NK_WIDGET_STATE_ACTIVED) {
            background = &style->pressed_active;
            text.text = style->text_pressed_active;
        } else if (state & NK_WIDGET_STATE_HOVER) {
            background = &style->hover_active;
            text.text = style->text_hover_active;
        } else {
            background = &style->normal_active;
            text.text = style->text_normal_active;
        }
    }


    /* draw selectable background and text */
    if (background->type == NK_STYLE_ITEM_IMAGE) {
        nk_draw_image(out, *bounds, &background->data.image, nk_white);
        text.background = nk_rgba(0,0,0,0);
    } else {
        nk_fill_rect(out, *bounds, style->rounding, background->data.color);
        text.background = background->data.color;
    }
    if (img && icon) nk_draw_image(out, *icon, img, nk_white);
    nk_widget_text(out, *bounds, string, len, &text, align, font);
}